

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O2

void trb_print_subtree_nodes
               (trt_node *node,uint32_t max_gap_before_type,trt_wrapper wr,trt_parent_cache ca,
               trt_printer_ctx *pc,trt_tree_ctx *tc)

{
  lysp_node *plVar1;
  bool bVar2;
  bool bVar3;
  trt_wrapper wr_00;
  trt_wrapper wr_01;
  trt_wrapper wr_02;
  trt_wrapper wr_03;
  trt_wrapper wr_04;
  undefined1 auVar4 [16];
  trt_wrapper wr_05;
  undefined8 uVar5;
  ly_bool lVar6;
  LY_ERR LVar7;
  uint32_t uVar8;
  void *pvVar9;
  lyplg_ext_sprinter_ctree_override_clb p_Var10;
  long lVar11;
  undefined8 uVar12;
  trt_tree_ctx *ptVar13;
  lyspr_tree_ctx *plVar14;
  trt_printer_ctx *ptVar15;
  trt_node *ptVar16;
  trt_printer_ctx *ptVar17;
  trt_node *ptVar18;
  uint64_t uVar19;
  lyplg_ext_sprinter_ctree_override_clb p_Var20;
  lysp_node_list *plVar21;
  bool bVar22;
  byte bVar23;
  trt_parent_cache ca_00;
  trt_parent_cache ca_01;
  trt_parent_cache tVar24;
  trt_parent_cache ca_02;
  trt_parent_cache tVar25;
  trt_parent_cache ca_03;
  trt_parent_cache ca_04;
  trt_parent_cache tVar26;
  ly_out *plVar27;
  _func_ly_bool_trt_tree_ctx_ptr *p_Var28;
  _func_trt_node_trt_parent_cache_trt_tree_ctx_ptr *p_Var29;
  uint uStack_200;
  ly_bool ignore;
  uint32_t max_gap_before_type_1;
  undefined8 local_1f8;
  lysp_node_list *local_1f0;
  uint64_t i;
  undefined8 local_1e0;
  lysp_node_list *local_1d8;
  void *local_1d0;
  lyspr_tree_ctx local_1c8;
  lyspr_tree_ctx plug_ctx;
  trt_node local_f8;
  trt_printer_ctx pc_dupl;
  
  bVar23 = 0;
  lVar6 = trp_node_is_empty(node);
  if (lVar6 == '\0') {
    local_1f0 = ca.last_list;
    local_1e0 = ca._0_8_;
    trb_print_entire_node(node,max_gap_before_type,wr,pc,tc);
    lVar6 = tc->lysc_tree;
    auVar4 = wr._8_16_;
    if (((lVar6 != '\0') && (pvVar9 = trp_ext_is_present(lVar6,tc->cn), pvVar9 != (void *)0x0)) ||
       (pvVar9 = trp_ext_is_present(lVar6,tc->pn), pvVar9 != (void *)0x0)) {
      uStack_200 = uStack_200 & 0xffffff;
      max_gap_before_type_1 = 0;
      tVar26.last_list = local_1f0;
      tVar26.ancestor = (undefined4)local_1e0;
      tVar26.lys_status = local_1e0._4_2_;
      tVar26.lys_config = local_1e0._6_2_;
      tVar26 = tro_parent_cache_for_child(tVar26,tc);
      local_1d8 = tVar26.last_list;
      local_1f8 = tVar26._0_8_;
      lVar6 = trb_node_is_last_sibling(&pc->fp,tc);
      if (lVar6 == '\0') {
        trp_wrapper_set_mark(wr);
      }
      else {
        wr_04.actual_pos = uStack_200;
        wr_04.type = auVar4._0_4_;
        wr_04._4_4_ = auVar4._4_4_;
        wr_04.bit_marks1 = auVar4._8_8_;
        wr_04._20_4_ = max_gap_before_type_1;
        trp_wrapper_set_shift(wr_04);
      }
      local_1d0 = tro_next_child((&tc->pn)[(ulong)(tc->lysc_tree != '\0') * 2],tc);
      i = 0;
      uVar19 = 0xffffffffffffffff;
      while (pvVar9 = trb_ext_iter(tc,&i), plVar21 = local_1d8, uVar12 = local_1f8,
            pvVar9 != (void *)0x0) {
        plug_ctx.schemas = (lyspr_tree_schema *)0x0;
        plug_ctx.plugin_priv = (void *)0x0;
        plug_ctx.free_plugin_priv = (_func_void_void_ptr *)0x0;
        LVar7 = tro_ext_printer_tree(tc->lysc_tree,pvVar9,&plug_ctx,&ignore);
        if (LVar7 != LY_SUCCESS) {
          tc->last_error = LVar7;
          goto LAB_0019022e;
        }
        if (ignore == '\0') {
          ca_02.last_list = local_1d8;
          ca_02.ancestor = (uint32_t)local_1f8;
          ca_02.lys_status = local_1f8._4_2_;
          ca_02.lys_config = local_1f8._6_2_;
          trb_ext_try_unified_indent(&plug_ctx,ca_02,&max_gap_before_type_1,pc,tc);
          if (plug_ctx.schemas != (lyspr_tree_schema *)0x0) {
            uVar19 = i;
          }
          trp_ext_free_plugin_ctx(&plug_ctx);
        }
        else {
          uStack_200 = uStack_200 & 0xffffff;
        }
      }
      if (local_1d0 != (void *)0x0) {
        tVar25.last_list = local_1d8;
        tVar25.ancestor = (uint32_t)local_1f8;
        tVar25.lys_status = local_1f8._4_2_;
        tVar25.lys_config = local_1f8._6_2_;
        (*(pc->fp).modify.next_child)((trt_node *)&plug_ctx,tVar25,tc);
        uVar5 = local_1f8;
        ca_03.last_list = plVar21;
        local_1f8._0_4_ = (uint32_t)uVar12;
        local_1f8._4_2_ = SUB82(uVar12,4);
        local_1f8._6_2_ = SUB82(uVar12,6);
        ca_03.ancestor = (uint32_t)local_1f8;
        ca_03.lys_status = local_1f8._4_2_;
        ca_03.lys_config = local_1f8._6_2_;
        local_1f8 = uVar5;
        uVar8 = trb_max_gap_to_type(ca_03,pc,tc);
        if (max_gap_before_type_1 < uVar8) {
          max_gap_before_type_1 = uVar8;
        }
        (*(pc->fp).modify.parent)(tc);
      }
      i = 0;
      while( true ) {
        pvVar9 = trb_ext_iter(tc,&i);
        if (pvVar9 == (void *)0x0) break;
        local_1c8.schemas = (lyspr_tree_schema *)0x0;
        local_1c8.plugin_priv = (void *)0x0;
        local_1c8.free_plugin_priv = (_func_void_void_ptr *)0x0;
        LVar7 = tro_ext_printer_tree(tc->lysc_tree,pvVar9,&local_1c8,&ignore);
        uVar8 = max_gap_before_type_1;
        if (LVar7 != LY_SUCCESS) {
          tc->last_error = LVar7;
          break;
        }
        if (ignore == '\0') {
          bVar2 = i == uVar19;
          bVar3 = local_1d0 == (void *)0x0;
          ptVar13 = tc;
          plVar14 = &plug_ctx;
          for (lVar11 = 0xd; lVar11 != 0; lVar11 = lVar11 + -1) {
            plVar14->schemas = *(lyspr_tree_schema **)ptVar13;
            ptVar13 = (trt_tree_ctx *)((long)ptVar13 + (ulong)bVar23 * -0x10 + 8);
            plVar14 = (lyspr_tree_ctx *)((long)plVar14 + (ulong)bVar23 * -0x10 + 8);
          }
          ptVar15 = pc;
          ptVar17 = &pc_dupl;
          for (lVar11 = 0xc; lVar11 != 0; lVar11 = lVar11 + -1) {
            ptVar17->out = ptVar15->out;
            ptVar15 = (trt_printer_ctx *)((long)ptVar15 + (ulong)bVar23 * -0x10 + 8);
            ptVar17 = (trt_printer_ctx *)((long)ptVar17 + (ulong)bVar23 * -0x10 + 8);
          }
          p_Var20 = (lyplg_ext_sprinter_ctree_override_clb)0x1;
          while( true ) {
            if (local_1c8.schemas == (lyspr_tree_schema *)0x0) {
              p_Var10 = (lyplg_ext_sprinter_ctree_override_clb)0x0;
            }
            else {
              p_Var10 = local_1c8.schemas[-1].field_2.cn_overr;
            }
            if (p_Var10 <= p_Var20 + -1) break;
            trm_reset_tree_ctx_by_plugin(&local_1c8,(uint64_t)(p_Var20 + -1),pc,tc);
            if (bVar2 && bVar3) {
              if (local_1c8.schemas == (lyspr_tree_schema *)0x0) {
                p_Var10 = (lyplg_ext_sprinter_ctree_override_clb)0x0;
              }
              else {
                p_Var10 = local_1c8.schemas[-1].field_2.cn_overr;
              }
              bVar22 = p_Var20 == p_Var10;
            }
            else {
              bVar22 = false;
            }
            (tc->plugin_ctx).last_schema = bVar22;
            local_f8.name.str = (char *)0x0;
            local_f8.name.add_opts = (char *)0x0;
            local_f8.name.type = TRD_NODE_ELSE;
            local_f8.name.keys = '\0';
            local_f8.name._5_3_ = 0;
            local_f8.name.module_prefix = (char *)0x0;
            local_f8.status = (char *)0x0;
            local_f8.flags = (char *)0x0;
            local_f8.name.opts = (char *)0x0;
            local_f8.type.type = TRD_TYPE_EMPTY;
            local_f8.type.str = (char *)0x0;
            local_f8.iffeatures.type = TRD_IFF_NON_PRESENT;
            local_f8.iffeatures.str = (char *)0x0;
            local_f8.last_one = '\x01';
            ca_01.last_list = local_1d8;
            ca_01.ancestor = (uint32_t)local_1f8;
            ca_01.lys_status = local_1f8._4_2_;
            ca_01.lys_config = local_1f8._6_2_;
            trb_print_subtree_nodes(&local_f8,uVar8,wr,ca_01,pc,tc);
            plVar14 = &plug_ctx;
            ptVar13 = tc;
            for (lVar11 = 0xd; lVar11 != 0; lVar11 = lVar11 + -1) {
              *(lyspr_tree_schema **)ptVar13 = plVar14->schemas;
              plVar14 = (lyspr_tree_ctx *)((long)plVar14 + (ulong)bVar23 * -0x10 + 8);
              ptVar13 = (trt_tree_ctx *)((long)ptVar13 + (ulong)bVar23 * -0x10 + 8);
            }
            p_Var20 = p_Var20 + 1;
          }
          ptVar15 = &pc_dupl;
          ptVar17 = pc;
          for (lVar11 = 0xc; lVar11 != 0; lVar11 = lVar11 + -1) {
            ptVar17->out = ptVar15->out;
            ptVar15 = (trt_printer_ctx *)((long)ptVar15 + (ulong)bVar23 * -0x10 + 8);
            ptVar17 = (trt_printer_ctx *)((long)ptVar17 + (ulong)bVar23 * -0x10 + 8);
          }
          trp_ext_free_plugin_ctx(&local_1c8);
        }
        else {
          uStack_200 = uStack_200 & 0xffffff;
        }
      }
    }
LAB_0019022e:
    lVar6 = trb_node_is_last_sibling(&pc->fp,tc);
    if (lVar6 == '\0') {
      trp_wrapper_set_mark(wr);
    }
    else {
      wr_05.actual_pos = uStack_200;
      wr_05.type = auVar4._0_4_;
      wr_05._4_4_ = auVar4._4_4_;
      wr_05.bit_marks1 = auVar4._8_8_;
      wr_05._20_4_ = max_gap_before_type_1;
      trp_wrapper_set_shift(wr_05);
    }
    wr._16_8_ = plug_ctx.free_plugin_priv;
    wr._0_8_ = plug_ctx.schemas;
    wr.bit_marks1 = (uint64_t)plug_ctx.plugin_priv;
    ca_04.last_list = local_1f0;
    ca_04.ancestor = (undefined4)local_1e0;
    ca_04.lys_status = local_1e0._4_2_;
    ca_04.lys_config = local_1e0._6_2_;
    ca = tro_parent_cache_for_child(ca_04,tc);
    (*(pc->fp).modify.next_child)((trt_node *)&plug_ctx,ca,tc);
    ptVar16 = (trt_node *)&plug_ctx;
    ptVar18 = node;
    for (lVar11 = 0xc; lVar11 != 0; lVar11 = lVar11 + -1) {
      ptVar18->status = ptVar16->status;
      ptVar16 = (trt_node *)((long)ptVar16 + (ulong)bVar23 * -0x10 + 8);
      ptVar18 = (trt_node *)((long)ptVar18 + (ulong)bVar23 * -0x10 + 8);
    }
    lVar6 = trp_node_is_empty(node);
    if (lVar6 != '\0') {
      return;
    }
    uVar8 = trb_max_gap_to_type(ca,pc,tc);
    local_1f8 = CONCAT44(local_1f8._4_4_,uVar8);
  }
  else {
    local_1f8 = CONCAT44(local_1f8._4_4_,max_gap_before_type);
    (*(pc->fp).modify.first_sibling)((trt_node *)&plug_ctx,ca,tc);
    plVar14 = &plug_ctx;
    ptVar16 = node;
    for (lVar11 = 0xc; lVar11 != 0; lVar11 = lVar11 + -1) {
      ptVar16->status = (char *)plVar14->schemas;
      plVar14 = (lyspr_tree_ctx *)((long)plVar14 + (ulong)bVar23 * -0x10 + 8);
      ptVar16 = (trt_node *)((long)ptVar16 + (ulong)bVar23 * -0x10 + 8);
    }
  }
  plVar21 = ca.last_list;
  uVar12 = ca._0_8_;
  do {
    if ((tc->plugin_ctx).filtered == '\0') {
      if (tc->lysc_tree == '\0') {
        plVar1 = tc->pn->parent;
        if (((plVar1 == (lysp_node *)0x0) || ((plVar1->nodetype & 2) == 0)) ||
           ((tc->pn->nodetype & 0x6f) == 0)) goto LAB_0018fc57;
        plug_ctx.schemas = (lyspr_tree_schema *)node->status;
        plug_ctx.plugin_priv = anon_var_dwarf_cfd19;
        plug_ctx.free_plugin_priv._0_5_ = CONCAT14((node->name).keys,1);
        local_1f0 = plVar21;
        ly_print_(pc->out,"\n");
        wr_01.bit_marks1 = wr.bit_marks1;
        wr_01.type = wr.type;
        wr_01._4_4_ = wr._4_4_;
        wr_01.actual_pos = wr.actual_pos;
        wr_01._20_4_ = wr._20_4_;
        trb_print_entire_node((trt_node *)&plug_ctx,0,wr_01,pc,tc);
        ly_print_(pc->out,"\n");
        lVar6 = (*(pc->fp).read.if_sibling_exists)(tc);
        if (lVar6 == '\0') {
          wr_03.bit_marks1 = wr._16_8_;
          wr_03._0_8_ = wr.bit_marks1;
          wr_03.actual_pos = uStack_200;
          wr_03._20_4_ = max_gap_before_type_1;
          trp_wrapper_set_shift(wr_03);
        }
        else {
          wr_02.bit_marks1 = wr.bit_marks1;
          wr_02.type = wr.type;
          wr_02._4_4_ = wr._4_4_;
          wr_02.actual_pos = wr.actual_pos;
          wr_02._20_4_ = wr._20_4_;
          trp_wrapper_set_mark(wr_02);
        }
        plug_ctx.schemas = (lyspr_tree_schema *)pc_dupl.out;
        plug_ctx.plugin_priv = pc_dupl.fp.modify.parent;
        plug_ctx.free_plugin_priv = (_func_void_void_ptr *)pc_dupl.fp.modify.first_sibling;
        plVar21 = local_1f0;
        plVar27 = pc_dupl.out;
        p_Var28 = pc_dupl.fp.modify.parent;
        p_Var29 = pc_dupl.fp.modify.first_sibling;
      }
      else {
LAB_0018fc57:
        ly_print_(pc->out,"\n");
        plVar27 = (ly_out *)wr._0_8_;
        p_Var28 = (_func_ly_bool_trt_tree_ctx_ptr *)wr.bit_marks1;
        p_Var29 = (_func_trt_node_trt_parent_cache_trt_tree_ctx_ptr *)wr._16_8_;
      }
      wr_00.bit_marks1 = (uint64_t)p_Var28;
      wr_00._0_8_ = plVar27;
      wr_00._16_8_ = p_Var29;
      ca_00.last_list = plVar21;
      ca_00.ancestor = (int)uVar12;
      ca_00.lys_status = (short)((ulong)uVar12 >> 0x20);
      ca_00.lys_config = (short)((ulong)uVar12 >> 0x30);
      trb_print_subtree_nodes(node,(uint32_t)local_1f8,wr_00,ca_00,pc,tc);
    }
    tVar24.last_list = plVar21;
    tVar24.ancestor = (int)uVar12;
    tVar24.lys_status = (short)((ulong)uVar12 >> 0x20);
    tVar24.lys_config = (short)((ulong)uVar12 >> 0x30);
    (*(pc->fp).modify.next_sibling)((trt_node *)&plug_ctx,tVar24,tc);
    ptVar16 = (trt_node *)&plug_ctx;
    ptVar18 = node;
    for (lVar11 = 0xc; lVar11 != 0; lVar11 = lVar11 + -1) {
      ptVar18->status = ptVar16->status;
      ptVar16 = (trt_node *)((long)ptVar16 + (ulong)bVar23 * -0x10 + 8);
      ptVar18 = (trt_node *)((long)ptVar18 + (ulong)bVar23 * -0x10 + 8);
    }
    lVar6 = trp_node_is_empty(node);
    if (lVar6 != '\0') {
      (*(pc->fp).modify.parent)(tc);
      return;
    }
  } while( true );
}

Assistant:

static void
trb_print_subtree_nodes(struct trt_node *node, uint32_t max_gap_before_type, struct trt_wrapper wr,
        struct trt_parent_cache ca, struct trt_printer_ctx *pc, struct trt_tree_ctx *tc)
{
    if (!trp_node_is_empty(node)) {
        /* Print root node. */
        trb_print_entire_node(node, max_gap_before_type, wr, pc, tc);
        if (trp_ext_is_present_in_node(tc)) {
            trb_ext_print_instances(wr, ca, pc, tc);
        }
        /* if node is last sibling, then do not add '|' to wrapper */
        wr = trb_node_is_last_sibling(&pc->fp, tc) ?
                trp_wrapper_set_shift(wr) : trp_wrapper_set_mark(wr);
        /* go to the child */
        ca = tro_parent_cache_for_child(ca, tc);
        *node = pc->fp.modify.next_child(ca, tc);
        if (trp_node_is_empty(node)) {
            return;
        }
        /* TODO comment browse through instances + filtered. try unified indentation for children */
        max_gap_before_type = trb_try_unified_indent(ca, pc, tc);
    } else {
        /* Root node is ignored, continue with child. */
        *node = pc->fp.modify.first_sibling(ca, tc);
    }

    do {
        if (!tc->plugin_ctx.filtered && !trb_need_implicit_node_case(tc)) {
            /* normal behavior */
            ly_print_(pc->out, "\n");
            trb_print_subtree_nodes(node, max_gap_before_type, wr, ca, pc, tc);
        } else if (!tc->plugin_ctx.filtered) {
            struct trt_wrapper wr_case_child;

            wr_case_child = trb_print_implicit_node(node, wr, pc, tc);
            trb_print_subtree_nodes(node, max_gap_before_type, wr_case_child, ca, pc, tc);
        }
        /* go to the actual node's sibling */
        *node = pc->fp.modify.next_sibling(ca, tc);
    } while (!trp_node_is_empty(node));

    /* get back from child node to root node */
    pc->fp.modify.parent(tc);
}